

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGB,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  BYTE BVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0058a4e7_caseD_0:
    lVar9 = 0;
    if (count < 1) {
      count = 0;
    }
    pbVar15 = pin + 2;
    for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
      iVar13 = (int)((uint)pbVar15[-2] * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000) >> 0x10;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      pout[lVar9 * 4 + 2] = (BYTE)iVar13;
      iVar13 = (int)((uint)pbVar15[-1] * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000) >> 0x10;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      pout[lVar9 * 4 + 1] = (BYTE)iVar13;
      iVar13 = (int)((uint)*pbVar15 * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      pout[lVar9 * 4] = (BYTE)iVar13;
      pout[lVar9 * 4 + 3] = 0xff;
      pbVar15 = pbVar15 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0058a4e7_caseD_0;
    case BLEND_ICEMAP:
      lVar9 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
        iVar13 = cRGB::Gray(pin);
        iVar13 = iVar13 >> 4;
        iVar7 = (int)((uint)IcePalette[iVar13][0] * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000
                     ) >> 0x10;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        pout[lVar9 * 4 + 2] = (BYTE)iVar7;
        iVar7 = (int)((uint)IcePalette[iVar13][1] * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000
                     ) >> 0x10;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        pout[lVar9 * 4 + 1] = (BYTE)iVar7;
        iVar13 = (int)((uint)IcePalette[iVar13][2] * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000)
                 >> 0x10;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar9 * 4] = (BYTE)iVar13;
        pout[lVar9 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar9 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar15 = pin + 2;
      for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
        iVar13 = inf->blendcolor[3];
        iVar7 = (int)(((uint)pbVar15[-2] * iVar13 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha
                     + (uint)pout[lVar9 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        bVar1 = pbVar15[-1];
        iVar14 = inf->blendcolor[1];
        bVar2 = *pbVar15;
        iVar3 = inf->blendcolor[2];
        pout[lVar9 * 4 + 2] = (BYTE)iVar7;
        iVar7 = (int)(((uint)bVar1 * iVar13 + iVar14 >> 0x10 & 0xff) * inf->alpha +
                     (uint)pout[lVar9 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        pout[lVar9 * 4 + 1] = (BYTE)iVar7;
        iVar13 = (int)(((uint)bVar2 * iVar13 + iVar3 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar9 * 4] = (BYTE)iVar13;
        pout[lVar9 * 4 + 3] = 0xff;
        pbVar15 = pbVar15 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar9 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar15 = pin + 2;
      for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
        iVar13 = (int)(((uint)pbVar15[-2] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        bVar1 = pbVar15[-1];
        iVar7 = inf->blendcolor[1];
        bVar2 = *pbVar15;
        iVar14 = inf->blendcolor[2];
        pout[lVar9 * 4 + 2] = (BYTE)iVar13;
        iVar13 = (int)(((uint)bVar1 * iVar7 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar9 * 4 + 1] = (BYTE)iVar13;
        iVar13 = (int)(((uint)bVar2 * iVar14 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar9 * 4] = (BYTE)iVar13;
        pout[lVar9 * 4 + 3] = 0xff;
        pbVar15 = pbVar15 + step;
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar9 = (long)EVar4;
      if (lVar9 < 0x21) {
        if (BLEND_ICEMAP < EVar4) {
          iVar13 = 0x20 - EVar4;
          lVar9 = 0;
          if (count < 1) {
            count = 0;
          }
          for (; count != (int)lVar9; lVar9 = lVar9 + 1) {
            iVar7 = cRGB::Gray(pin);
            iVar7 = iVar7 * (EVar4 + BLEND_MODULATE);
            bVar1 = pin[1];
            bVar2 = pin[2];
            iVar14 = ((int)((uint)*pin * iVar13 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                     (uint)pout[lVar9 * 4 + 2] * 0x10000;
            BVar12 = (BYTE)((uint)iVar14 >> 0x10);
            if (0xfe < iVar14 >> 0x10) {
              BVar12 = 0xff;
            }
            pout[lVar9 * 4 + 2] = BVar12;
            iVar14 = ((int)((uint)bVar1 * iVar13 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                     (uint)pout[lVar9 * 4 + 1] * 0x10000;
            BVar12 = (BYTE)((uint)iVar14 >> 0x10);
            if (0xfe < iVar14 >> 0x10) {
              BVar12 = 0xff;
            }
            pout[lVar9 * 4 + 1] = BVar12;
            iVar7 = ((int)((uint)bVar2 * iVar13 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                    (uint)pout[lVar9 * 4] * 0x10000;
            BVar12 = (BYTE)((uint)iVar7 >> 0x10);
            if (0xfe < iVar7 >> 0x10) {
              BVar12 = 0xff;
            }
            pout[lVar9 * 4] = BVar12;
            pout[lVar9 * 4 + 3] = 0xff;
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
          uVar6 = cRGB::Gray(pin);
          uVar8 = 0xff;
          if (uVar6 < 0xff) {
            uVar8 = uVar6;
          }
          if ((int)uVar6 < 1) {
            uVar8 = 0;
          }
          uVar10 = (ulong)uVar8;
          iVar13 = (int)((uint)*(byte *)((long)pFVar5 + uVar10 * 4 + lVar9 * 0x518 + -0xa6fe) *
                         inf->alpha + (uint)pout[lVar11 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          bVar1 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar9 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar9 * 0x518 + -0xa6ff);
          pout[lVar11 * 4 + 2] = (BYTE)iVar13;
          iVar13 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar11 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar11 * 4 + 1] = (BYTE)iVar13;
          iVar13 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar11 * 4] = (BYTE)iVar13;
          pout[lVar11 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}